

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_http.hpp
# Opt level: O1

shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response>
 __thiscall
SimpleWeb::
ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
::request(ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
          *this,string *request_type,string *path,ostream *content,
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *header)

{
  int iVar1;
  long lVar2;
  long lVar3;
  _func_int **pp_Var4;
  basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__nptr;
  error_category *peVar5;
  basic_streambuf_ref<std::allocator<char>_> bVar6;
  undefined1 auVar7 [8];
  _Alloc_hider _Var8;
  uint uVar9;
  char cVar10;
  int iVar11;
  ulong __val;
  ostream *poVar12;
  _Rb_tree_node_base *p_Var13;
  size_t sVar14;
  const_iterator cVar15;
  mapped_type *pmVar16;
  element_type *peVar17;
  ulonglong uVar18;
  int *piVar19;
  ulong uVar20;
  transfer_exactly_t completion_condition;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var21;
  uint __len;
  long in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  istream *piVar23;
  bool bVar24;
  shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response>
  sVar25;
  string_view delim;
  string_view delim_00;
  string line;
  string corrected_path;
  string buffer;
  string __str;
  streambuf streambuf;
  ostream response_content_output_stream;
  streambuf write_buffer;
  ostream write_stream;
  undefined8 local_4d8;
  error_category *local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  undefined8 local_4b8;
  error_category *local_4b0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_4a8;
  long *local_4a0;
  char *local_498;
  long local_490 [2];
  undefined1 *local_480;
  undefined8 local_478;
  undefined1 local_470;
  undefined7 uStack_46f;
  shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response>
  local_460;
  io_service *local_450;
  key_type local_448;
  basic_streambuf_ref<std::allocator<char>_> local_428;
  undefined1 local_420 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  _Alloc_hider local_400;
  size_type local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0 [11];
  char acStack_338 [40];
  undefined1 local_310 [8];
  error_category *local_308;
  locale local_2d8 [16];
  pointer local_2c8;
  pointer local_2b8;
  undefined1 local_2b0 [5];
  uint3 uStack_2ab;
  error_category *local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  _Alloc_hider local_290;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280 [14];
  undefined1 local_1a0 [72];
  pointer local_158;
  pointer local_148;
  allocator<char> local_140 [8];
  ios_base local_138 [264];
  
  local_4a0 = local_490;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4a0,*(long *)content,*(long *)(content + 8) + *(long *)content);
  iVar11 = std::__cxx11::string::compare((char *)&local_4a0);
  if (iVar11 == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_4a0,0,local_498,0x17c937);
  }
  std::ostream::seekp((long)header,_S_beg);
  __val = std::ostream::tellp();
  std::ostream::seekp((long)header,_S_beg);
  boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            ((basic_streambuf<std::allocator<char>_> *)local_1a0,0xffffffffffffffff,local_140);
  local_4a8 = header;
  std::ostream::ostream(local_140,(streambuf *)local_1a0);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_140,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,(char *)local_4a0,(long)local_498);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," HTTP/1.1\r\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_140,"Host: ",6);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_140,*(char **)((long)&request_type[4].field_2 + 8),
                       (long)request_type[5]._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\r\n",2);
  p_Var13 = *(_Rb_tree_node_base **)(in_R9 + 0x18);
  if (p_Var13 != (_Rb_tree_node_base *)(in_R9 + 8)) {
    do {
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_140,*(char **)(p_Var13 + 1),(long)p_Var13[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ",2);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,*(char **)(p_Var13 + 2),(long)p_Var13[2]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\r\n",2);
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
    } while (p_Var13 != (_Rb_tree_node_base *)(in_R9 + 8));
  }
  if (0 < (long)__val) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_140,"Content-Length: ",0x10)
    ;
    __len = 1;
    if (9 < __val) {
      uVar20 = __val;
      uVar9 = 4;
      do {
        __len = uVar9;
        if (uVar20 < 100) {
          __len = __len - 2;
          goto LAB_00155577;
        }
        if (uVar20 < 1000) {
          __len = __len - 1;
          goto LAB_00155577;
        }
        if (uVar20 < 10000) goto LAB_00155577;
        bVar24 = 99999 < uVar20;
        uVar20 = uVar20 / 10000;
        uVar9 = __len + 4;
      } while (bVar24);
      __len = __len + 1;
    }
LAB_00155577:
    local_420._0_8_ = &local_410;
    std::__cxx11::string::_M_construct((ulong)local_420,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_420._0_8_,__len,__val);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_140,(char *)local_420._0_8_,local_420._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\r\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._0_8_ != &local_410) {
      operator_delete((void *)local_420._0_8_,local_410._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_140,"\r\n",2);
  if (0 < (long)__val) {
    std::ostream::operator<<
              (local_140,
               *(streambuf **)
                ((long)&local_4a8[4]._M_t._M_impl.super__Rb_tree_header._M_node_count +
                *(long *)(*(long *)&(local_4a8->_M_t)._M_impl + -0x18)));
  }
  this->_vptr_ClientBase = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>::Response,std::allocator<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>::Response>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->asio_io_service,(Response **)this,
             (allocator<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response>
              *)local_420);
  local_450 = &this->asio_io_service;
  (**(code **)(request_type->_M_dataplus)._M_p)(request_type);
  _local_2b0 = (undefined **)((ulong)uStack_2ab << 0x28);
  local_2a8 = (error_category *)&boost::system::detail::cat_holder<void>::system_category_instance;
  local_310 = (undefined1  [8])local_1a0;
  boost::asio::
  write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::basic_streambuf_ref<std::allocator<char>>,boost::asio::detail::transfer_all_t>
            (request_type[4]._M_dataplus._M_p,local_310,local_2b0,0);
  local_410._8_8_ = local_2a8;
  _Var8._M_p = (pointer)_local_2b0;
  if (local_2b0[4] == true) {
    std::runtime_error::runtime_error((runtime_error *)local_420,"write");
    local_400._M_p = (pointer)local_3f0;
    local_420._0_8_ = &PTR__system_error_00193058;
    local_410._M_allocated_capacity = (size_type)_Var8._M_p;
    local_3f8 = 0;
    local_3f0[0]._M_local_buf[0] = '\0';
    boost::throw_exception<boost::system::system_error>((system_error *)local_420);
  }
  local_310 = (undefined1  [8])(this->_vptr_ClientBase + 0x32);
  _local_2b0 = (undefined **)((ulong)_local_2b0 & 0xffffff0000000000);
  local_2a8 = (error_category *)&boost::system::detail::cat_holder<void>::system_category_instance;
  delim._M_str = "\r\n\r\n";
  delim._M_len = 4;
  sVar14 = boost::asio::
           read_until<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::basic_streambuf_ref<std::allocator<char>>>
                     ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                       *)request_type[4]._M_dataplus._M_p,
                      (basic_streambuf_ref<std::allocator<char>_> *)local_310,delim,
                      (error_code *)local_2b0,(type *)0x0);
  local_410._8_8_ = local_2a8;
  _Var8._M_p = (pointer)_local_2b0;
  if (local_2b0[4] == true) {
    std::runtime_error::runtime_error((runtime_error *)local_420,"read_until");
    local_400._M_p = (pointer)local_3f0;
    local_420._0_8_ = &PTR__system_error_00193058;
    local_410._M_allocated_capacity = (size_type)_Var8._M_p;
    local_3f8 = 0;
    local_3f0[0]._M_local_buf[0] = '\0';
    boost::throw_exception<boost::system::system_error>((system_error *)local_420);
  }
  local_460.
  super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this->_vptr_ClientBase;
  lVar2 = *(long *)&((local_460.
                      super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->content_buffer).field_0x10;
  lVar3 = *(long *)&((local_460.
                      super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->content_buffer).field_0x28;
  local_460.
  super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (this->asio_io_service).super_execution_context.service_registry_;
  if ((service_registry *)
      local_460.
      super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (service_registry *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (((service_registry *)
       local_460.
       super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->mutex_).mutex_.__data.__lock =
           (((service_registry *)
            local_460.
            super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->mutex_).mutex_.__data.__lock + 1;
      UNLOCK();
    }
    else {
      (((service_registry *)
       local_460.
       super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->mutex_).mutex_.__data.__lock =
           (((service_registry *)
            local_460.
            super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->mutex_).mutex_.__data.__lock + 1;
    }
  }
  parse_response_header
            ((ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
              *)request_type,&local_460,(istream *)(this->_vptr_ClientBase + 8));
  local_4a8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)lVar2;
  if ((service_registry *)
      local_460.
      super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (service_registry *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_460.
               super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  pp_Var4 = this->_vptr_ClientBase;
  paVar22 = &local_410;
  local_420._0_8_ = paVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"Content-Length","");
  cVar15 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(pp_Var4 + 0x2b),(key_type *)local_420);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._0_8_ != paVar22) {
    operator_delete((void *)local_420._0_8_,local_410._M_allocated_capacity + 1);
  }
  peVar17 = (element_type *)this;
  if (cVar15.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
LAB_00155897:
    pp_Var4 = (_func_int **)(peVar17->http_version)._M_dataplus._M_p;
    local_420._0_8_ = paVar22;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"Transfer-Encoding","");
    cVar15 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(pp_Var4 + 0x2b),(key_type *)local_420);
    if (cVar15.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      bVar24 = false;
    }
    else {
      pp_Var4 = (_func_int **)(peVar17->http_version)._M_dataplus._M_p;
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"Transfer-Encoding","");
      pmVar16 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)(pp_Var4 + 0x2b),&local_448);
      iVar11 = std::__cxx11::string::compare((char *)pmVar16);
      bVar24 = iVar11 == 0;
      peVar17 = (element_type *)this;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._0_8_ != paVar22) {
      operator_delete((void *)local_420._0_8_,local_410._M_allocated_capacity + 1);
    }
    if (bVar24) {
      boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
                ((basic_streambuf<std::allocator<char>_> *)local_310,0xffffffffffffffff,
                 (allocator<char> *)local_420);
      std::ostream::ostream(local_420,(streambuf *)local_310);
      local_480 = &local_470;
      local_478 = 0;
      local_470 = 0;
      do {
        local_4b8 = (basic_streambuf<std::allocator<char>_> *)
                    ((long)(peVar17->http_version)._M_dataplus._M_p + 400);
        local_4d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((ulong)local_4d8 & 0xffffff0000000000);
        local_4d0 = (error_category *)
                    &boost::system::detail::cat_holder<void>::system_category_instance;
        delim_00._M_str = "\r\n";
        delim_00._M_len = 2;
        sVar14 = boost::asio::
                 read_until<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::basic_streambuf_ref<std::allocator<char>>>
                           ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                             *)request_type[4]._M_dataplus._M_p,
                            (basic_streambuf_ref<std::allocator<char>_> *)&local_4b8,delim_00,
                            (error_code *)&local_4d8,(type *)0x0);
        local_2a0._8_8_ = local_4d0;
        local_2a0._M_allocated_capacity = (size_type)local_4d8;
        if (local_4d8._4_1_ == true) {
          std::runtime_error::runtime_error((runtime_error *)local_2b0,"read_until");
          local_290._M_p = (pointer)local_280;
          _local_2b0 = &PTR__system_error_00193058;
          local_288 = 0;
          local_280[0]._M_local_buf[0] = '\0';
          boost::throw_exception<boost::system::system_error>((system_error *)local_2b0);
        }
        local_4d0 = (error_category *)0x0;
        local_4c8._M_local_buf[0] = '\0';
        pp_Var4 = (_func_int **)(peVar17->http_version)._M_dataplus._M_p;
        piVar23 = (istream *)(pp_Var4 + 8);
        local_4d8 = &local_4c8;
        cVar10 = std::ios::widen((char)*(undefined8 *)(pp_Var4[8] + -0x18) + (char)piVar23);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  (piVar23,(string *)&local_4d8,cVar10);
        peVar5 = local_4d0;
        std::__cxx11::string::pop_back();
        paVar22 = local_4d8;
        piVar19 = __errno_location();
        iVar11 = *piVar19;
        *piVar19 = 0;
        uVar18 = strtoull(paVar22->_M_local_buf,(char **)local_2b0,0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_2b0 == paVar22) {
          std::__throw_invalid_argument("stoull");
LAB_00155e0d:
          std::__throw_out_of_range("stoull");
LAB_00155e19:
          peVar5 = local_4b0;
          bVar6.sb_ = local_4b8;
          std::runtime_error::runtime_error((runtime_error *)local_2b0,"read");
          local_290._M_p = (pointer)local_280;
          _local_2b0 = &PTR__system_error_00193058;
          local_2a0._M_allocated_capacity = (size_type)bVar6.sb_;
          local_2a0._8_8_ = peVar5;
          local_288 = 0;
          local_280[0]._M_local_buf[0] = '\0';
          boost::throw_exception<boost::system::system_error>((system_error *)local_2b0);
        }
        if (*piVar19 == 0) {
          *piVar19 = iVar11;
        }
        else if (*piVar19 == 0x22) goto LAB_00155e0d;
        pp_Var4 = this->_vptr_ClientBase;
        completion_condition.size_ =
             (long)(uVar18 + 2) -
             (long)(pp_Var4[0x37] + (1 - (long)(pp_Var4[0x34] + sVar14)) +
                   (long)&peVar5->_vptr_error_category);
        if (pp_Var4[0x37] + (1 - (long)(pp_Var4[0x34] + sVar14)) +
            (long)&peVar5->_vptr_error_category <= (_func_int *)(uVar18 + 2) &&
            completion_condition.size_ != 0) {
          local_428.sb_ = (basic_streambuf<std::allocator<char>_> *)(pp_Var4 + 0x32);
          local_4b8 = local_4b8 & 0xffffff0000000000;
          local_4b0 = (error_category *)
                      &boost::system::detail::cat_holder<void>::system_category_instance;
          boost::asio::
          read<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::basic_streambuf_ref<std::allocator<char>>,boost::asio::detail::transfer_exactly_t>
                    ((basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                      *)request_type[4]._M_dataplus._M_p,&local_428,completion_condition,
                     (error_code *)&local_4b8,(type *)0x0);
          if (local_4b8._4_1_ == true) goto LAB_00155e19;
        }
        std::__cxx11::string::resize((ulong)&local_480,(char)uVar18);
        std::istream::read((char *)(this->_vptr_ClientBase + 8),(long)local_480);
        std::ostream::write(local_420,(long)local_480);
        std::istream::get();
        std::istream::get();
        if (local_4d8 != &local_4c8) {
          operator_delete(local_4d8,
                          CONCAT71(local_4c8._M_allocated_capacity._1_7_,local_4c8._M_local_buf[0])
                          + 1);
        }
        peVar17 = (element_type *)this;
      } while (uVar18 != 0);
      std::ostream::ostream(local_2b0,(streambuf *)(this->_vptr_ClientBase + 0x32));
      std::ostream::operator<<
                (local_2b0,*(streambuf **)(acStack_338 + (long)*(char **)(local_420._0_8_ - 0x18)));
      std::ios_base::~ios_base((ios_base *)&local_2a8);
      if (local_480 != &local_470) {
        operator_delete(local_480,CONCAT71(uStack_46f,local_470) + 1);
      }
      std::ios_base::~ios_base((ios_base *)(local_420 + 8));
      local_310 = (undefined1  [8])&PTR__basic_streambuf_00193de8;
      if (local_2c8 != (pointer)0x0) {
        operator_delete(local_2c8,(long)local_2b8 - (long)local_2c8);
      }
      local_310 = (undefined1  [8])__assert_fail;
      std::locale::~locale(local_2d8);
    }
  }
  else {
    s = (basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
         *)request_type[4]._M_dataplus._M_p;
    pp_Var4 = this->_vptr_ClientBase;
    _local_2b0 = (undefined **)&local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"Content-Length","");
    pmVar16 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)(pp_Var4 + 0x2b),(key_type *)local_2b0);
    __nptr = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pmVar16->_M_dataplus)._M_p;
    peVar17 = (element_type *)__errno_location();
    iVar11 = *(int *)&(peVar17->http_version)._M_dataplus._M_p;
    *(int *)&(peVar17->http_version)._M_dataplus._M_p = 0;
    paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_420;
    uVar18 = strtoull(__nptr->_M_local_buf,(char **)&paVar22->_M_allocated_capacity,10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._0_8_ == __nptr) {
      std::__throw_invalid_argument("stoull");
      goto LAB_00155f30;
    }
    iVar1 = *(int *)&(peVar17->http_version)._M_dataplus._M_p;
    if (iVar1 == 0) {
      *(int *)&(peVar17->http_version)._M_dataplus._M_p = iVar11;
    }
    else if (iVar1 == 0x22) {
      std::__throw_out_of_range("stoull");
      goto LAB_00155897;
    }
    local_448._M_dataplus._M_p = (pointer)(pp_Var4 + 0x32);
    local_310 = (undefined1  [8])((ulong)local_310 & 0xffffff0000000000);
    local_308 = (error_category *)&boost::system::detail::cat_holder<void>::system_category_instance
    ;
    boost::asio::
    read<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::basic_streambuf_ref<std::allocator<char>>,boost::asio::detail::transfer_exactly_t>
              (s,(basic_streambuf_ref<std::allocator<char>_> *)&local_448,
               (transfer_exactly_t)((sVar14 - lVar3) + (long)local_4a8 + uVar18),
               (error_code *)local_310,(type *)0x0);
    if (local_310[4] == true) {
LAB_00155f30:
      peVar5 = local_308;
      auVar7 = local_310;
      std::runtime_error::runtime_error((runtime_error *)local_420,"read");
      local_400._M_p = (pointer)local_3f0;
      local_420._0_8_ = &PTR__system_error_00193058;
      local_410._M_allocated_capacity = (size_type)auVar7;
      local_410._8_8_ = peVar5;
      local_3f8 = 0;
      local_3f0[0]._M_local_buf[0] = '\0';
      boost::throw_exception<boost::system::system_error>((system_error *)local_420);
    }
    peVar17 = (element_type *)this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_2b0 != &local_2a0) {
      operator_delete(_local_2b0,local_2a0._M_allocated_capacity + 1);
    }
  }
  std::ios_base::~ios_base(local_138);
  local_1a0._0_8_ = &PTR__basic_streambuf_00193de8;
  if (local_158 != (pointer)0x0) {
    operator_delete(local_158,(long)local_148 - (long)local_158);
  }
  local_1a0._0_8_ = __assert_fail;
  std::locale::~locale((locale *)(local_1a0 + 0x38));
  _Var21._M_pi = extraout_RDX;
  if (local_4a0 != local_490) {
    operator_delete(local_4a0,local_490[0] + 1);
    _Var21._M_pi = extraout_RDX_00;
  }
  sVar25.
  super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var21._M_pi;
  sVar25.
  super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar17;
  return (shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response>
          )sVar25.
           super___shared_ptr<SimpleWeb::ClientBase<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>::Response,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<Response> request(const std::string& request_type, const std::string& path, std::ostream& content, 
                const std::map<std::string, std::string>& header=std::map<std::string, std::string>()) {
            std::string corrected_path=path;
            if(corrected_path=="")
                corrected_path="/";
            
            content.seekp(0, std::ios::end);
            long content_length = content.tellp();
            content.seekp(0, std::ios::beg);
            
            boost::asio::streambuf write_buffer;
            std::ostream write_stream(&write_buffer);
            write_stream << request_type << " " << corrected_path << " HTTP/1.1\r\n";
            write_stream << "Host: " << host << "\r\n";
            for(auto& h: header) {
                write_stream << h.first << ": " << h.second << "\r\n";
            }
            if(content_length>0)
                write_stream << "Content-Length: " << std::to_string(content_length) << "\r\n";
            write_stream << "\r\n";
            if(content_length>0)
                write_stream << content.rdbuf();
            
            //std::shared_ptr<Response> response(new Response());
            auto response(std::make_shared<Response>());
            
            try {
                connect();
                
                boost::asio::write(*socket, write_buffer);

                auto bytes_transferred = boost::asio::read_until(*socket, response->content_buffer, "\r\n\r\n");

                size_t num_additional_bytes = response->content_buffer.size()-bytes_transferred;

                parse_response_header(response, response->content);
                                
                if(response->header.count("Content-Length")>0) {
                    boost::asio::read(*socket, response->content_buffer, 
                            boost::asio::transfer_exactly(stoull(response->header["Content-Length"])-num_additional_bytes));
                }
                else if(response->header.count("Transfer-Encoding")>0 && response->header["Transfer-Encoding"]=="chunked") {
                    boost::asio::streambuf streambuf;
                    std::ostream contentLocal(&streambuf);
                    
                    size_t length;
                    std::string buffer;
                    do {
                        auto bytes_transferredLocal = boost::asio::read_until(*socket, response->content_buffer, "\r\n");
                        std::string line;
                        getline(response->content, line);
                        bytes_transferredLocal -= line.size()+1;
                        line.pop_back();
                        length=stoull(line, 0, 16);

                        size_t num_additional_bytesLocal = response->content_buffer.size()-bytes_transferredLocal;
                    
                        if((2+length) > num_additional_bytesLocal) {
                            boost::asio::read(*socket, response->content_buffer, 
                                boost::asio::transfer_exactly(
									2+length-num_additional_bytesLocal)
								);
                        }
                                                
                        buffer.resize(static_cast<size_t>(length));
                        response->content.read(&buffer[0], 
							static_cast<std::streamsize>(length)
						);
                        contentLocal.write(&buffer[0], 
							static_cast<std::streamsize>(length)
						);

                        //Remove "\r\n"
                        response->content.get();
                        response->content.get();
                    } while(length>0);
                    
                    std::ostream response_content_output_stream(&response->content_buffer);
                    response_content_output_stream << contentLocal.rdbuf();
                }
            }
            catch(const std::exception& e) {
                socket_error=true;
                throw std::invalid_argument(e.what());
            }
            
            return response;
        }